

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O3

void __thiscall
TEST_MockComparatorCopierTest_customObjectParameterSucceeds_Test::testBody
          (TEST_MockComparatorCopierTest_customObjectParameterSucceeds_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MyTypeForTesting object;
  MyTypeForTestingComparator comparator;
  SimpleString SStack_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  undefined **local_28;
  undefined8 *local_20;
  undefined **local_18;
  
  local_28 = &PTR__MyTypeForTesting_002b2490;
  local_20 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_20 = 1;
  local_18 = &PTR__MockNamedValueComparator_002b27b0;
  SimpleString::SimpleString(&SStack_68,"");
  pMVar2 = mock(&SStack_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&local_58,&local_18);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::SimpleString(&SStack_68,"");
  pMVar2 = mock(&SStack_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_58);
  SimpleString::SimpleString(&local_38,"MyTypeForTesting");
  SimpleString::SimpleString(&local_48,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_38,&local_48,&local_28);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::SimpleString(&SStack_68,"");
  pMVar2 = mock(&SStack_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_58);
  SimpleString::SimpleString(&local_38,"MyTypeForTesting");
  SimpleString::SimpleString(&local_48,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_38,&local_48,&local_28);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::SimpleString(&SStack_68,"");
  pMVar2 = mock(&SStack_68,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::SimpleString(&SStack_68,"");
  pMVar2 = mock(&SStack_68,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&SStack_68);
  local_28 = &PTR__MyTypeForTesting_002b2490;
  operator_delete(local_20,8);
  return;
}

Assistant:

MyTypeForTesting(long val)
    {
        value = new long(val);
    }